

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version_number.cpp
# Opt level: O2

uint ON_GetVersionString(uint major_version,uint minor_version,uint year,uint month,
                        uint day_of_month,uint hour,uint minute,uint branch,
                        size_t string_buffer_capacity,char *string_buffer)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  unsigned_short quartet_values [4];
  char local_48 [32];
  
  quartet_values[0] = 0;
  quartet_values[1] = 0;
  quartet_values[2] = 0;
  quartet_values[3] = 0;
  uVar3 = ON_GetVersionQuartet
                    (major_version,minor_version,year,month,day_of_month,hour,minute,branch,
                     quartet_values);
  pcVar9 = local_48;
  if (string_buffer != (char *)0x0 && string_buffer_capacity != 0) {
    pcVar9 = string_buffer;
  }
  uVar10 = 0x18;
  if (string_buffer != (char *)0x0 && string_buffer_capacity != 0) {
    uVar10 = string_buffer_capacity;
  }
  uVar4 = 0;
  uVar8 = 0;
  if (uVar3 != 0) {
    uVar11 = 0;
    uVar12 = 0;
    while( true ) {
      uVar8 = (uint)uVar12;
      if ((3 < uVar11) || (uVar10 <= uVar12)) goto LAB_006602f5;
      uVar13 = uVar12;
      uVar3 = uVar8;
      if (uVar11 != 0) {
        uVar3 = uVar8 + 1;
        uVar13 = (ulong)uVar3;
        pcVar9[uVar12] = '.';
      }
      if (uVar10 == uVar13) break;
      uVar1 = quartet_values[uVar11];
      uVar8 = (uint)uVar1;
      iVar6 = 0;
      do {
        iVar5 = iVar6;
        iVar6 = iVar5 + -1;
        bVar2 = 9 < uVar8;
        uVar8 = uVar8 / 10;
      } while (bVar2);
      uVar8 = 0;
      if (uVar10 - uVar13 <= (ulong)(uint)-iVar6) goto LAB_006602f5;
      pcVar9[(uint)-iVar6 + uVar13] = '\0';
      uVar14 = -iVar5;
      uVar7 = (uint)uVar1;
      do {
        pcVar9[uVar14 + uVar13] = (byte)((ulong)uVar7 % 10) | 0x30;
        uVar14 = uVar14 - 1;
        bVar2 = 9 < uVar7;
        uVar7 = uVar7 / 10;
      } while (bVar2);
      if (iVar6 == 0) goto LAB_006602f5;
      uVar12 = (ulong)(uVar3 - iVar6);
      uVar11 = uVar11 + 1;
    }
    uVar8 = 0;
  }
LAB_006602f5:
  uVar11 = uVar4;
  if (uVar8 <= uVar10) {
    uVar4 = (ulong)uVar8;
    uVar11 = uVar4;
  }
  for (; uVar4 < uVar10; uVar4 = (ulong)((int)uVar4 + 1)) {
    pcVar9[uVar4] = '\0';
  }
  return (uint)uVar11;
}

Assistant:

unsigned int ON_GetVersionString(
  unsigned int major_version,
  unsigned int minor_version,
  unsigned int year,
  unsigned int month,
  unsigned int day_of_month,
  unsigned int hour,
  unsigned int minute,
  unsigned int branch,
  size_t string_buffer_capacity,
  char* string_buffer
  )
{
  char s[24] = {0};
  const size_t s_capacity = sizeof(s)/sizeof(s[0]);
  unsigned int string_length = 0;
  unsigned int i, j;
  unsigned short quartet_values[4] = {0};
  unsigned int version_number = ON_GetVersionQuartet(
                                      major_version,
                                      minor_version,
                                      year,
                                      month,
                                      day_of_month,
                                      hour,
                                      minute,
                                      branch,
                                      quartet_values
                                      );

  if (string_buffer_capacity <= 0 || nullptr == string_buffer)
  {
    string_buffer_capacity = s_capacity;
    string_buffer = s;
  }

  if ( version_number > 0 )
  {
    for(i = 0; i < 4 && string_length < string_buffer_capacity; i++ )
    {
      if ( i > 0 )
        string_buffer[string_length++] = '.';

      j = AppendValueToString(
        quartet_values[i],
        string_buffer_capacity - string_length,
        string_buffer + string_length
        );

      if ( j <= 0 )
      {
        string_length = 0;
        break;
      }

      string_length += j;

    }
  }

  if ( string_length > string_buffer_capacity )
    string_length = 0;

  for ( i = string_length; i < string_buffer_capacity; i++ )
    string_buffer[i] = 0;

  return string_length;
}